

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

deUint32 glu::getInternalFormat(TextureFormat texFormat)

{
  deUint32 dVar1;
  InternalError *this;
  ChannelType CVar2;
  string local_40;
  
  CVar2 = texFormat.order << 0x10 | texFormat.type;
  if (0x7ffff < (int)CVar2) {
    if ((int)CVar2 < 0xc0003) {
      switch(CVar2) {
      case 0x80000:
        return 0x8f97;
      case 0x80001:
        return 0x8f9b;
      case 0x80003:
        return 0x8058;
      case 0x80004:
        return 0x805b;
      case 0x8000a:
        return 0x8056;
      case 0x8000b:
        return 0x8057;
      case 0x8000f:
        return 0x8059;
      case 0x80015:
        return 0x906f;
      case 0x8001b:
        return 0x8d8e;
      case 0x8001c:
        return 0x8d88;
      case 0x8001d:
        return 0x8d82;
      case 0x8001e:
        return 0x8d7c;
      case 0x8001f:
        return 0x8d76;
      case 0x80021:
        return 0x8d70;
      case 0x80022:
        return 0x881a;
      case 0x80023:
        return 0x8814;
      }
    }
    else if ((int)CVar2 < 0x120019) {
      if ((int)CVar2 < 0xe0003) {
        if (CVar2 == 0xc0003) {
          return 0x8fbd;
        }
        if (CVar2 == 0xd0003) {
          return 0x8fbe;
        }
      }
      else {
        if (CVar2 == 0xe0003) {
          return 0x8c41;
        }
        if (CVar2 == 0xf0003) {
          return 0x8c43;
        }
        if (CVar2 == 0x120004) {
          return 0x81a5;
        }
      }
    }
    else if ((int)CVar2 < 0x13001e) {
      if (CVar2 == 0x120019) {
        return 0x81a6;
      }
      if (CVar2 == 0x120021) {
        return 0x81a7;
      }
      if (CVar2 == 0x120023) {
        return 0x8cac;
      }
    }
    else {
      if (CVar2 == 0x13001e) {
        return 0x8d48;
      }
      if (CVar2 == 0x140019) {
        return 0x88f0;
      }
      if (CVar2 == 0x140025) {
        return 0x8cad;
      }
    }
    goto switchD_004f59b7_caseD_70002;
  }
  if ((int)CVar2 < 0x5001b) {
    switch(CVar2) {
    case SIGNED_INT8:
      dVar1 = 0x8231;
      break;
    case SIGNED_INT16:
      dVar1 = 0x8233;
      break;
    case SIGNED_INT32:
      dVar1 = 0x8235;
      break;
    case UNSIGNED_INT8:
      dVar1 = 0x8232;
      break;
    case UNSIGNED_INT16:
      dVar1 = 0x8234;
      break;
    case UNSIGNED_INT24:
      goto switchD_004f59b7_caseD_70002;
    case UNSIGNED_INT32:
      dVar1 = 0x8236;
      break;
    case HALF_FLOAT:
      dVar1 = 0x822d;
      break;
    case FLOAT:
      dVar1 = 0x822e;
      break;
    default:
      switch(CVar2) {
      case SNORM_INT8:
        dVar1 = 0x8f94;
        break;
      case SNORM_INT16:
        dVar1 = 0x8f98;
        break;
      case SNORM_INT32:
        goto switchD_004f59b7_caseD_70002;
      case UNORM_INT8:
        dVar1 = 0x8229;
        break;
      case UNORM_INT16:
        dVar1 = 0x822a;
        break;
      default:
        switch(CVar2) {
        case 0x50000:
          dVar1 = 0x8f95;
          break;
        case 0x50001:
          dVar1 = 0x8f99;
          break;
        default:
          goto switchD_004f59b7_caseD_70002;
        case 0x50003:
          dVar1 = 0x822b;
          break;
        case 0x50004:
          dVar1 = 0x822c;
        }
      }
    }
  }
  else {
    switch(CVar2) {
    case 0x70000:
      dVar1 = 0x8f96;
      break;
    case 0x70001:
      dVar1 = 0x8f9a;
      break;
    case 0x70002:
    case 0x70005:
    case 0x70006:
    case 0x70007:
    case 0x70009:
    case 0x7000a:
    case 0x7000b:
    case 0x7000c:
    case 0x7000d:
    case 0x7000e:
    case 0x70010:
    case 0x70011:
    case 0x70012:
    case 0x70013:
    case 0x70014:
    case 0x70015:
    case 0x70018:
    case 0x70019:
    case 0x7001a:
    case 0x70020:
switchD_004f59b7_caseD_70002:
      this = (InternalError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Can\'t map texture format to GL internal format","");
      tcu::InternalError::InternalError(this,&local_40);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    case 0x70003:
      dVar1 = 0x8051;
      break;
    case 0x70004:
      dVar1 = 0x8054;
      break;
    case 0x70008:
      dVar1 = 0x8d62;
      break;
    case 0x7000f:
      dVar1 = 0x8052;
      break;
    case 0x70016:
      dVar1 = 0x8c3a;
      break;
    case 0x70017:
      dVar1 = 0x8c3d;
      break;
    case 0x7001b:
      dVar1 = 0x8d8f;
      break;
    case 0x7001c:
      dVar1 = 0x8d89;
      break;
    case 0x7001d:
      dVar1 = 0x8d83;
      break;
    case 0x7001e:
      dVar1 = 0x8d7d;
      break;
    case 0x7001f:
      dVar1 = 0x8d77;
      break;
    case 0x70021:
      dVar1 = 0x8d71;
      break;
    case 0x70022:
      dVar1 = 0x881b;
      break;
    case 0x70023:
      dVar1 = 0x8815;
      break;
    default:
      switch(CVar2) {
      case 0x5001b:
        dVar1 = 0x8237;
        break;
      case 0x5001c:
        dVar1 = 0x8239;
        break;
      case 0x5001d:
        dVar1 = 0x823b;
        break;
      case 0x5001e:
        dVar1 = 0x8238;
        break;
      case 0x5001f:
        dVar1 = 0x823a;
        break;
      default:
        goto switchD_004f59b7_caseD_70002;
      case 0x50021:
        dVar1 = 0x823c;
        break;
      case 0x50022:
        dVar1 = 0x822f;
        break;
      case 0x50023:
        dVar1 = 0x8230;
      }
    }
  }
  return dVar1;
}

Assistant:

deUint32 getInternalFormat (tcu::TextureFormat texFormat)
{
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELORDER_LAST < (1<<16));
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELTYPE_LAST < (1<<16));

#define PACK_FMT(ORDER, TYPE) ((int(ORDER) << 16) | int(TYPE))
#define FMT_CASE(ORDER, TYPE) PACK_FMT(tcu::TextureFormat::ORDER, tcu::TextureFormat::TYPE)

	switch (PACK_FMT(texFormat.order, texFormat.type))
	{
		case FMT_CASE(RGBA,		UNORM_SHORT_5551):				return GL_RGB5_A1;
		case FMT_CASE(RGBA,		UNORM_SHORT_4444):				return GL_RGBA4;
		case FMT_CASE(RGB,		UNORM_SHORT_565):				return GL_RGB565;
		case FMT_CASE(D,		UNORM_INT16):					return GL_DEPTH_COMPONENT16;
		case FMT_CASE(S,		UNSIGNED_INT8):					return GL_STENCIL_INDEX8;

		case FMT_CASE(RGBA,		FLOAT):							return GL_RGBA32F;
		case FMT_CASE(RGBA,		SIGNED_INT32):					return GL_RGBA32I;
		case FMT_CASE(RGBA,		UNSIGNED_INT32):				return GL_RGBA32UI;
		case FMT_CASE(RGBA,		UNORM_INT16):					return GL_RGBA16;
		case FMT_CASE(RGBA,		SNORM_INT16):					return GL_RGBA16_SNORM;
		case FMT_CASE(RGBA,		HALF_FLOAT):					return GL_RGBA16F;
		case FMT_CASE(RGBA,		SIGNED_INT16):					return GL_RGBA16I;
		case FMT_CASE(RGBA,		UNSIGNED_INT16):				return GL_RGBA16UI;
		case FMT_CASE(RGBA,		UNORM_INT8):					return GL_RGBA8;
		case FMT_CASE(RGBA,		SIGNED_INT8):					return GL_RGBA8I;
		case FMT_CASE(RGBA,		UNSIGNED_INT8):					return GL_RGBA8UI;
		case FMT_CASE(sRGBA,	UNORM_INT8):					return GL_SRGB8_ALPHA8;
		case FMT_CASE(RGBA,		UNORM_INT_1010102_REV):			return GL_RGB10_A2;
		case FMT_CASE(RGBA,		UNSIGNED_INT_1010102_REV):		return GL_RGB10_A2UI;
		case FMT_CASE(RGBA,		SNORM_INT8):					return GL_RGBA8_SNORM;

		case FMT_CASE(RGB,		UNORM_INT8):					return GL_RGB8;
		case FMT_CASE(RGB,		UNSIGNED_INT_11F_11F_10F_REV):	return GL_R11F_G11F_B10F;
		case FMT_CASE(RGB,		FLOAT):							return GL_RGB32F;
		case FMT_CASE(RGB,		SIGNED_INT32):					return GL_RGB32I;
		case FMT_CASE(RGB,		UNSIGNED_INT32):				return GL_RGB32UI;
		case FMT_CASE(RGB,		UNORM_INT16):					return GL_RGB16;
		case FMT_CASE(RGB,		SNORM_INT16):					return GL_RGB16_SNORM;
		case FMT_CASE(RGB,		HALF_FLOAT):					return GL_RGB16F;
		case FMT_CASE(RGB,		SIGNED_INT16):					return GL_RGB16I;
		case FMT_CASE(RGB,		UNSIGNED_INT16):				return GL_RGB16UI;
		case FMT_CASE(RGB,		SNORM_INT8):					return GL_RGB8_SNORM;
		case FMT_CASE(RGB,		SIGNED_INT8):					return GL_RGB8I;
		case FMT_CASE(RGB,		UNSIGNED_INT8):					return GL_RGB8UI;
		case FMT_CASE(sRGB,		UNORM_INT8):					return GL_SRGB8;
		case FMT_CASE(RGB,		UNSIGNED_INT_999_E5_REV):		return GL_RGB9_E5;
		case FMT_CASE(RGB,		UNORM_INT_1010102_REV):			return GL_RGB10;

		case FMT_CASE(RG,		FLOAT):							return GL_RG32F;
		case FMT_CASE(RG,		SIGNED_INT32):					return GL_RG32I;
		case FMT_CASE(RG,		UNSIGNED_INT32):				return GL_RG32UI;
		case FMT_CASE(RG,		UNORM_INT16):					return GL_RG16;
		case FMT_CASE(RG,		SNORM_INT16):					return GL_RG16_SNORM;
		case FMT_CASE(RG,		HALF_FLOAT):					return GL_RG16F;
		case FMT_CASE(RG,		SIGNED_INT16):					return GL_RG16I;
		case FMT_CASE(RG,		UNSIGNED_INT16):				return GL_RG16UI;
		case FMT_CASE(RG,		UNORM_INT8):					return GL_RG8;
		case FMT_CASE(RG,		SIGNED_INT8):					return GL_RG8I;
		case FMT_CASE(RG,		UNSIGNED_INT8):					return GL_RG8UI;
		case FMT_CASE(RG,		SNORM_INT8):					return GL_RG8_SNORM;
		case FMT_CASE(sRG,		UNORM_INT8):					return GL_SRG8_EXT;

		case FMT_CASE(R,		FLOAT):							return GL_R32F;
		case FMT_CASE(R,		SIGNED_INT32):					return GL_R32I;
		case FMT_CASE(R,		UNSIGNED_INT32):				return GL_R32UI;
		case FMT_CASE(R,		UNORM_INT16):					return GL_R16;
		case FMT_CASE(R,		SNORM_INT16):					return GL_R16_SNORM;
		case FMT_CASE(R,		HALF_FLOAT):					return GL_R16F;
		case FMT_CASE(R,		SIGNED_INT16):					return GL_R16I;
		case FMT_CASE(R,		UNSIGNED_INT16):				return GL_R16UI;
		case FMT_CASE(R,		UNORM_INT8):					return GL_R8;
		case FMT_CASE(R,		SIGNED_INT8):					return GL_R8I;
		case FMT_CASE(R,		UNSIGNED_INT8):					return GL_R8UI;
		case FMT_CASE(R,		SNORM_INT8):					return GL_R8_SNORM;
		case FMT_CASE(sR,		UNORM_INT8):					return GL_SR8_EXT;

		case FMT_CASE(D,		FLOAT):							return GL_DEPTH_COMPONENT32F;
		case FMT_CASE(D,		UNSIGNED_INT_24_8):				return GL_DEPTH_COMPONENT24;
		case FMT_CASE(D,		UNSIGNED_INT32):				return GL_DEPTH_COMPONENT32;
		case FMT_CASE(DS,		FLOAT_UNSIGNED_INT_24_8_REV):	return GL_DEPTH32F_STENCIL8;
		case FMT_CASE(DS,		UNSIGNED_INT_24_8):				return GL_DEPTH24_STENCIL8;

		default:
			throw tcu::InternalError("Can't map texture format to GL internal format");
	}
}